

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O1

void CKNCF(int *ncf)

{
  ncf[0] = 0;
  ncf[1] = 0;
  ncf[2] = 0;
  ncf[3] = 0;
  ncf[4] = 0;
  ncf[5] = 0;
  ncf[6] = 0;
  ncf[7] = 0;
  ncf[8] = 0;
  ncf[9] = 0;
  ncf[10] = 0;
  ncf[0xb] = 0;
  ncf[0xc] = 0;
  ncf[0xd] = 0;
  ncf[0xe] = 0;
  ncf[0xf] = 0;
  ncf[0x10] = 0;
  ncf[0x11] = 0;
  ncf[0x12] = 0;
  ncf[0x13] = 0;
  ncf[0x14] = 0;
  ncf[0x15] = 0;
  ncf[0x16] = 0;
  ncf[0x17] = 0;
  ncf[0x17] = 0;
  ncf[0x18] = 0;
  ncf[0x19] = 0;
  ncf[0x1a] = 0;
  *ncf = 2;
  ncf[4] = 2;
  ncf[6] = 2;
  ncf[7] = 1;
  ncf[9] = 1;
  ncf[0xd] = 1;
  ncf[0xf] = 1;
  ncf[0x10] = 1;
  ncf[0x12] = 1;
  ncf[0x13] = 2;
  ncf[0x15] = 2;
  ncf[0x16] = 2;
  ncf[0x1a] = 2;
  return;
}

Assistant:

void
CKNCF(int* ncf)
{
  int id; // loop counter
  int kd = 3;
  // Zero ncf
  for (id = 0; id < kd * 9; ++id) {
    ncf[id] = 0;
  }

  // H2
  ncf[0 * kd + 0] = 2; // H

  // O2
  ncf[1 * kd + 1] = 2; // O

  // H2O
  ncf[2 * kd + 0] = 2; // H
  ncf[2 * kd + 1] = 1; // O

  // H
  ncf[3 * kd + 0] = 1; // H

  // O
  ncf[4 * kd + 1] = 1; // O

  // OH
  ncf[5 * kd + 0] = 1; // H
  ncf[5 * kd + 1] = 1; // O

  // HO2
  ncf[6 * kd + 0] = 1; // H
  ncf[6 * kd + 1] = 2; // O

  // H2O2
  ncf[7 * kd + 0] = 2; // H
  ncf[7 * kd + 1] = 2; // O

  // N2
  ncf[8 * kd + 2] = 2; // N
}